

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

int32_t __thiscall icu_63::IndianCalendar::handleGetExtendedYear(IndianCalendar *this)

{
  UCalendarDateFields UVar1;
  undefined4 local_14;
  int32_t year;
  IndianCalendar *this_local;
  
  UVar1 = Calendar::newerField(&this->super_Calendar,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar1 == UCAL_EXTENDED_YEAR) {
    local_14 = Calendar::internalGet(&this->super_Calendar,UCAL_EXTENDED_YEAR,1);
  }
  else {
    local_14 = Calendar::internalGet(&this->super_Calendar,UCAL_YEAR,1);
  }
  return local_14;
}

Assistant:

int32_t IndianCalendar::handleGetExtendedYear() {
    int32_t year;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        year = internalGet(UCAL_YEAR, 1); // Default to year 1
    }

    return year;
}